

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  cmState *pcVar1;
  bool bVar2;
  char *pcVar3;
  string *psVar4;
  string path;
  string changeVars;
  string cnameString;
  string langComp;
  string pathString;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_",(allocator<char> *)&local_e8);
  std::__cxx11::string::append((string *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  pcVar3 = cmMakefile::GetDefinition(mf,&local_68);
  if (pcVar3 == (char *)0x0) {
    if (optional) goto LAB_0023b758;
    std::operator+(&local_e8,&local_68," not set, after EnableLanguage");
    cmSystemTools::Error(&local_e8);
  }
  else {
    psVar4 = cmMakefile::GetRequiredDefinition(mf,&local_68);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::FileIsFullPath(psVar4);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_e8);
    }
    else {
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_88._16_8_ = (pointer)0x0;
      cmsys::SystemTools::FindProgram
                (&local_a8,psVar4,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88,false);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
    }
    if (optional) {
LAB_0023b56c:
      psVar4 = cmState::GetInitializedCacheValue(this->CMakeInstance->State,&local_68);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      if (psVar4 != (string *)0x0 && !optional) {
        local_88._0_8_ = local_88 + 0x10;
        local_88._8_8_ = (pointer)0x0;
        local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
        bVar2 = cmsys::SystemTools::FileIsFullPath(psVar4);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)local_88);
        }
        else {
          local_c8._M_dataplus._M_p = (pointer)0x0;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::FindProgram
                    (&local_48,psVar4,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_c8,false);
          std::__cxx11::string::operator=((string *)local_88,(string *)&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_c8);
        }
        std::__cxx11::string::string((string *)&local_48,(string *)&local_e8);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_88);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_48);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,&local_48);
        if (bVar2) {
          pcVar1 = this->CMakeInstance->State;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_e9);
          pcVar3 = cmState::GetGlobalProperty(pcVar1,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_a8);
            std::__cxx11::string::append((char *)&local_a8);
          }
          std::__cxx11::string::append((string *)&local_a8);
          std::__cxx11::string::append((char *)&local_a8);
          std::__cxx11::string::append((string *)&local_a8);
          pcVar1 = this->CMakeInstance->State;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_e9);
          cmState::SetGlobalProperty(pcVar1,&local_c8,local_a8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)local_88);
      }
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else if (local_e8._M_string_length != 0) {
      bVar2 = cmsys::SystemTools::FileExists(&local_e8);
      if (bVar2) goto LAB_0023b56c;
    }
  }
  std::__cxx11::string::~string((string *)&local_e8);
LAB_0023b758:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = "CMAKE_";
  langComp += lang;
  langComp += "_COMPILER";

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  const std::string* cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);
  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      const char* cvars =
        this->GetCMakeInstance()->GetState()->GetGlobalProperty(
          "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}